

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<unsigned_short,_4U>::getSINTPacked
          (ImageT<unsigned_short,_4U> *this,uint32_t c0,uint32_t c1,uint32_t c2,uint32_t c3)

{
  uint32_t uVar1;
  uchar *puVar2;
  unsigned_short *puVar3;
  int in_ECX;
  int in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  allocator_type *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar4;
  uint32_t pack;
  uchar *target;
  Color *pixel;
  uint32_t x;
  uint32_t y;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  allocator_type *__n;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint *local_50;
  color<unsigned_short,_4U> *local_48;
  uint local_3c;
  uint local_38;
  undefined1 local_21;
  int local_20;
  int local_1c;
  int local_18;
  
  if (in_EDX + in_ECX + in_R8D + in_R9D != 0x20) {
    __assert_fail("c0 + c1 + c2 + c3 == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x431,
                  "virtual std::vector<uint8_t> ImageT<unsigned short, 4>::getSINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 4]"
                 );
  }
  bVar4 = false;
  if (((in_EDX != 0) && (bVar4 = false, in_ECX != 0)) && (bVar4 = false, in_R8D != 0)) {
    bVar4 = in_R9D != 0;
  }
  if (bVar4) {
    local_21 = 0;
    __n = in_RDI;
    local_20 = in_R9D;
    local_1c = in_R8D;
    local_18 = in_ECX;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x24b893);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(in_RSI,(size_type)__n,in_RDI)
    ;
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x24b8b2);
    for (local_38 = 0;
        local_38 <
        *(uint *)((long)&(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                         ._M_impl.super__Vector_impl_data._M_finish + 4); local_38 = local_38 + 1) {
      for (local_3c = 0;
          local_3c <
          *(uint *)&(in_RSI->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish; local_3c = local_3c + 1) {
        local_48 = (color<unsigned_short,_4U> *)
                   (in_RSI[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start +
                   (ulong)(local_38 *
                           *(int *)&(in_RSI->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_finish + local_3c) * 8);
        puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x24b913);
        local_50 = (uint *)(puVar2 + (ulong)(local_38 *
                                             *(int *)&(in_RSI->
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                            local_3c) * 4);
        local_54 = 0;
        puVar3 = color<unsigned_short,_4U>::operator[](local_48,0);
        local_58 = (uint)*puVar3;
        imageio::bit_cast<unsigned_int,int>((int *)&local_58);
        uVar1 = imageio::convertSINT
                          ((uint32_t)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI,
                           (uint32_t)((ulong)__n >> 0x20));
        local_54 = uVar1 << ((char)local_18 + (char)local_1c + (char)local_20 & 0x1fU) | local_54;
        puVar3 = color<unsigned_short,_4U>::operator[](local_48,1);
        local_5c = (uint)*puVar3;
        imageio::bit_cast<unsigned_int,int>((int *)&local_5c);
        uVar1 = imageio::convertSINT
                          ((uint32_t)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI,
                           (uint32_t)((ulong)__n >> 0x20));
        local_54 = uVar1 << ((char)local_1c + (char)local_20 & 0x1fU) | local_54;
        puVar3 = color<unsigned_short,_4U>::operator[](local_48,2);
        local_60 = (uint)*puVar3;
        imageio::bit_cast<unsigned_int,int>((int *)&local_60);
        uVar1 = imageio::convertSINT
                          ((uint32_t)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI,
                           (uint32_t)((ulong)__n >> 0x20));
        local_54 = uVar1 << ((byte)local_20 & 0x1f) | local_54;
        puVar3 = color<unsigned_short,_4U>::operator[](local_48,3);
        local_64 = (uint)*puVar3;
        imageio::bit_cast<unsigned_int,int>((int *)&local_64);
        uVar1 = imageio::convertSINT
                          ((uint32_t)((ulong)in_RSI >> 0x20),(uint32_t)in_RSI,
                           (uint32_t)((ulong)__n >> 0x20));
        local_54 = uVar1 | local_54;
        *local_50 = local_54;
      }
    }
    return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__n;
  }
  __assert_fail("c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x432,
                "virtual std::vector<uint8_t> ImageT<unsigned short, 4>::getSINTPacked(uint32_t, uint32_t, uint32_t, uint32_t) const [componentType = unsigned short, componentCount = 4]"
               );
}

Assistant:

virtual std::vector<uint8_t> getSINTPacked(uint32_t c0, uint32_t c1, uint32_t c2, uint32_t c3) const override {
        assert(c0 + c1 + c2 + c3 == 32);
        assert(c0 != 0 && c1 != 0 && c2 != 0 && c3 != 0);
        assert(componentCount == 4);

        std::vector<uint8_t> data(height * width * sizeof(uint32_t));
        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                const auto& pixel = pixels[y * width + x];
                auto* target = data.data() + (y * width + x) * sizeof(uint32_t);

                uint32_t pack = 0;
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[0])), sizeof(uint32_t) * 8, c0) << (c1 + c2 + c3);
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[1])), sizeof(uint32_t) * 8, c1) << (c2 + c3);
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[2])), sizeof(uint32_t) * 8, c2) << c3;
                pack |= imageio::convertSINT(imageio::bit_cast<uint32_t>(static_cast<int32_t>(pixel[3])), sizeof(uint32_t) * 8, c3);

                std::memcpy(target, &pack, sizeof(pack));
            }
        }

        return data;
    }